

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__nptr;
  uint64_t *puVar1;
  byte bVar2;
  char **ppcVar3;
  ulong *puVar4;
  ulong uVar5;
  uint64_t *t;
  int iVar6;
  int extraout_EAX;
  char *pcVar7;
  char *pcVar8;
  int *piVar9;
  ulong uVar10;
  FILE *__stream;
  long lVar11;
  os_thread_t *poVar12;
  char *__s1;
  ulong uVar13;
  long lVar14;
  param_t *ppVar15;
  param_t *p;
  ulonglong uVar16;
  void *arg;
  char **ppcVar17;
  uint64_t *puVar18;
  undefined1 auStack_20068 [8];
  os_thread_t th [4096];
  rng_t rng;
  void *local_38;
  uint64_t ndummies;
  
  pcVar7 = argv[1];
  if (pcVar7 == (char *)0x0) goto LAB_00104709;
  dir = pcVar7;
  if ((*pcVar7 != '.') && (pcVar7 = strchr(pcVar7,0x2f), pcVar7 == (char *)0x0)) goto LAB_00104722;
  pcVar7 = argv[2];
  if (pcVar7 != (char *)0x0) {
    ppcVar17 = argv + 2;
    do {
      pcVar8 = strchr(pcVar7,0x3d);
      if (pcVar8 == (char *)0x0) goto LAB_001046c2;
      if (pcVar8[1] == '\0') goto LAB_001046ba;
      __nptr = pcVar8 + 1;
      __s1 = "n_threads";
      ppVar15 = params;
      while ((iVar6 = strncmp(__s1,pcVar7,(long)pcVar8 - (long)pcVar7), iVar6 != 0 ||
             (__s1[(long)pcVar8 - (long)pcVar7] != '\0'))) {
        __s1 = ppVar15[1].name;
        ppVar15 = ppVar15 + 1;
        if (__s1 == (char *)0x0) {
          main_cold_2();
          goto LAB_001046aa;
        }
      }
      puVar18 = ppVar15->var;
      if (puVar18 == (uint64_t *)0x0) {
        iVar6 = strcmp(__s1,"latency_file");
        if (iVar6 != 0) goto LAB_001046ee;
      }
      else {
        ppcVar3 = ppVar15->enums;
        if (ppcVar3 == (char **)0x0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar16 = strtoull(__nptr,(char **)auStack_20068,0);
          if (*piVar9 != 0) goto LAB_001046fe;
          bVar2 = *(byte *)auStack_20068;
          if (bVar2 < 0x4b) {
            if (bVar2 != 0) {
              if ((bVar2 != 0x47) ||
                 ((*(byte *)((long)auStack_20068 + 1) != 0 &&
                  ((*(byte *)((long)auStack_20068 + 1) != 0x42 ||
                   (*(byte *)((long)auStack_20068 + 2) != 0)))))) goto LAB_001046f3;
              uVar16 = uVar16 << 0x1e;
            }
          }
          else if (bVar2 == 0x54) {
            if ((*(byte *)((long)auStack_20068 + 1) != 0) &&
               ((*(byte *)((long)auStack_20068 + 1) != 0x42 ||
                (*(byte *)((long)auStack_20068 + 2) != 0)))) goto LAB_001046f3;
            uVar16 = uVar16 << 0x28;
          }
          else if (bVar2 == 0x4d) {
            if ((*(byte *)((long)auStack_20068 + 1) != 0) &&
               ((*(byte *)((long)auStack_20068 + 1) != 0x42 ||
                (*(byte *)((long)auStack_20068 + 2) != 0)))) goto LAB_001046f3;
            uVar16 = uVar16 << 0x14;
          }
          else {
            if ((bVar2 != 0x4b) ||
               ((*(byte *)((long)auStack_20068 + 1) != 0 &&
                ((*(byte *)((long)auStack_20068 + 1) != 0x42 ||
                 (*(byte *)((long)auStack_20068 + 2) != 0)))))) goto LAB_001046f3;
            uVar16 = uVar16 << 10;
          }
        }
        else {
          pcVar7 = *ppcVar3;
          if (pcVar7 == (char *)0x0) {
LAB_001046aa:
            main_cold_3();
            goto LAB_001046b5;
          }
          uVar16 = 0;
          while (iVar6 = strcasecmp(__nptr,pcVar7), iVar6 != 0) {
            pcVar7 = ppcVar3[uVar16 + 1];
            uVar16 = uVar16 + 1;
            if (pcVar7 == (char *)0x0) goto LAB_001046aa;
          }
        }
        if (uVar16 < ppVar15->min) goto LAB_001046cf;
        if (ppVar15->max < uVar16) goto LAB_001046dd;
        *puVar18 = uVar16;
        __nptr = latency_file;
      }
      latency_file = __nptr;
      pcVar7 = ppcVar17[1];
      ppcVar17 = ppcVar17 + 1;
    } while (pcVar7 != (char *)0x0);
  }
  if (n_threads == 0) {
    uVar10 = sysconf(0x54);
    uVar10 = uVar10 & 0xffffffff;
    n_threads = 0x1000;
    if (uVar10 < 0x1000) {
      n_threads = uVar10;
    }
    if (uVar10 == 0) goto LAB_0010472c;
  }
  if (max_size < min_size) goto LAB_0010470e;
  printf("Parameters:\n  %-20s : %s\n","dir",dir);
  ppVar15 = params;
  pcVar7 = "n_threads";
  do {
    puVar4 = ppVar15->var;
    if (puVar4 != (ulong *)0x0) {
      printf("  %-20s : ",pcVar7);
      ppcVar17 = ppVar15->enums;
      if (ppcVar17 == (char **)0x0) {
        uVar10 = *puVar4;
        if (uVar10 == 0xffffffffffffffff) {
          printf(anon_var_dwarf_5b5);
        }
        else {
          if ((uVar10 & 0x3ff) == 0 && uVar10 != 0) {
            lVar11 = 0;
            uVar13 = uVar10;
            do {
              uVar10 = uVar13 >> 10;
              lVar11 = lVar11 + 1;
              if (uVar13 == 0) break;
              uVar5 = uVar13 & 0xffc00;
              uVar13 = uVar10;
            } while (uVar5 == 0);
          }
          else {
            lVar11 = 0;
          }
          printf("%lu%s",uVar10,(long)&DAT_00106694 + (long)(int)(&DAT_00106694)[lVar11]);
        }
      }
      else {
        pcVar7 = (char *)0xffffffffffffffff;
        do {
          pcVar8 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while (ppcVar17[(long)pcVar8] != (char *)0x0);
        pcVar8 = (char *)*puVar4;
        if (pcVar8 < pcVar7) {
          pcVar8 = ppcVar17[(long)pcVar8];
          pcVar7 = "%s";
        }
        else {
          pcVar7 = "enum out of range: %lu";
        }
        printf(pcVar7,pcVar8);
      }
      putchar(10);
    }
    pcVar7 = ppVar15[1].name;
    ppVar15 = ppVar15 + 1;
  } while (pcVar7 != (char *)0x0);
  lotta_zeroes = mmap((void *)0x0,max_size,1,0x8022,-1,0);
  if (lotta_zeroes == (void *)0x0) goto LAB_00104713;
  randomize_r((rng_t *)((long)th + 0x1fff8),seed);
  vsize_seed = rnd64_r((rng_t *)((long)th + 0x1fff8));
  os_cond_init(&ready.cond);
  os_mutex_init(&ready.mutex);
  ready.wanted = n_threads;
  cache = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(cache,cache_size);
  vmemcache_set_extent_size(cache,cache_extent_size);
  vmemcache_set_eviction_policy(cache,(undefined4)repl_policy);
  iVar6 = vmemcache_add(cache,dir);
  if (iVar6 != 0) goto LAB_00104718;
  if (latency_samples != 0) {
    lVar11 = n_threads * ops_count;
    latencies = (uint64_t *)malloc(lVar11 * 8 + 8);
    if (latencies != (uint64_t *)0x0) {
      latencies[lVar11] = 0xffffffffffffffff;
      goto LAB_0010437c;
    }
    goto LAB_0010471d;
  }
LAB_0010437c:
  if (junk_start != 0) {
    puts("Pre-filling the cache with junk...");
    memset(auStack_20068,0x21,0x100);
    vmemcache_callback_on_evict(cache,on_evict_cb,0);
    local_38 = (void *)0x0;
    if (cache_is_full == '\0') {
      do {
        local_38 = (void *)((long)local_38 + 1);
        vmemcache_put(cache,&local_38,8,auStack_20068,0x100);
      } while (cache_is_full != '\x01');
    }
    vmemcache_callback_on_evict(cache,0,0);
  }
  vmemcache_bench_set(cache,0,type == 0);
  vmemcache_bench_set(cache,2,1);
  if (warm_up != 0) {
    vmemcache_bench_set(cache,3,1);
  }
  puts("Spawning threads...");
  if (n_threads == 0) {
LAB_001044f8:
    uVar10 = 0;
  }
  else {
    poVar12 = (os_thread_t *)auStack_20068;
    arg = (void *)0x0;
    do {
      iVar6 = os_thread_create(poVar12,(os_thread_attr_t *)0x0,worker,arg);
      if (iVar6 != 0) goto LAB_001046b5;
      arg = (void *)((long)arg + 1);
      poVar12 = poVar12 + 1;
    } while (arg < n_threads);
    if (n_threads == 0) goto LAB_001044f8;
    poVar12 = (os_thread_t *)auStack_20068;
    uVar13 = 0;
    uVar10 = 0;
    do {
      iVar6 = os_thread_join(poVar12,&local_38);
      if (iVar6 != 0) goto LAB_001046ca;
      uVar10 = uVar10 + (long)local_38;
      uVar13 = uVar13 + 1;
      poVar12 = poVar12 + 1;
    } while (uVar13 < n_threads);
  }
  puts("Done.");
  print_stats(cache);
  if (latencies == (uint64_t *)0x0) {
LAB_001045f2:
    vmemcache_delete(cache);
    printf("Total time: %lu.%09lu s\n",uVar10 / 1000000000,uVar10 % 1000000000);
    uVar10 = (uVar10 / n_threads) / ops_count;
    printf(anon_var_dwarf_682,uVar10 / 1000,uVar10 % 1000);
    free(latencies);
    return 0;
  }
  __stream = _stdout;
  if ((latency_file == (char *)0x0) || (__stream = fopen(latency_file,"w"), __stream != (FILE *)0x0)
     ) {
    qsort(latencies,ops_count * n_threads,8,cmp_u64);
    t = latencies;
    latencies[n_threads * ops_count] = 0xffffffffffffffff;
    puVar18 = t + -1;
    lVar11 = -8;
    do {
      lVar11 = lVar11 + 8;
      puVar1 = puVar18 + 1;
      puVar18 = puVar18 + 1;
    } while (-1 < (long)*puVar1);
    lVar14 = ops_count * n_threads;
    print_ntiles((FILE *)__stream,t,lVar11 >> 3);
    print_ntiles((FILE *)__stream,puVar18,lVar14 - (lVar11 >> 3));
    if (latency_file != (char *)0x0) {
      fclose(__stream);
    }
    goto LAB_001045f2;
  }
  goto LAB_00104727;
LAB_001046b5:
  main_cold_13();
LAB_001046ba:
  main_cold_9();
LAB_001046c2:
  main_cold_10();
LAB_001046ca:
  main_cold_14();
LAB_001046cf:
  main_cold_6();
LAB_001046dd:
  main_cold_5();
LAB_001046ee:
  main_cold_8();
LAB_001046f3:
  main_cold_7();
LAB_001046fe:
  main_cold_4();
LAB_00104709:
  main_cold_19();
LAB_0010470e:
  main_cold_17();
LAB_00104713:
  main_cold_16();
LAB_00104718:
  main_cold_11();
LAB_0010471d:
  main_cold_12();
LAB_00104722:
  main_cold_1();
LAB_00104727:
  main_cold_15();
LAB_0010472c:
  main_cold_18();
  cache_is_full = 1;
  return extraout_EAX;
}

Assistant:

int
main(int argc, const char **argv)
{
	parse_args(argv + 1);

	if (!n_threads) {
		n_threads = (uint32_t)sysconf(_SC_NPROCESSORS_ONLN);
		if (n_threads > MAX_THREADS)
			n_threads = MAX_THREADS;
		if (!n_threads)
			UT_FATAL("can't obtain number of processor cores");
	}

	if (min_size > max_size)
		UT_FATAL("min_size > max_size");

	printf("Parameters:\n  %-20s : %s\n", "dir", dir);
	for (struct param_t *p = params; p->name; p++) {
		if (!p->var)
			continue;

		printf("  %-20s : ", p->name);
		if (p->enums) {
			uint64_t nvalid = 0;
			for (; p->enums[nvalid]; nvalid++)
				;

			if (*p->var < nvalid)
				printf("%s", p->enums[*p->var]);
			else
				printf("enum out of range: %lu", *p->var);
		} else
			print_units(*p->var);
		printf("\n");
	}

	lotta_zeroes = mmap(NULL, max_size, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes) {
		UT_FATAL("couldn't grab a zero buffer: mmap failed: %s",
			strerror(errno));
	}

	run_bench();

	return 0;
}